

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_poc(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *pOVar1;
  OPJ_SIZE_T OVar2;
  OPJ_BYTE *new_header_tile_data;
  OPJ_UINT32 l_poc_room;
  opj_tcp_t *l_tcp;
  OPJ_UINT32 l_written_size;
  OPJ_UINT32 l_poc_size;
  OPJ_UINT32 l_nb_poc;
  OPJ_UINT32 l_nb_comp;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  l_tcp._0_4_ = 0;
  _l_nb_poc = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_stream;
  p_stream_local = (opj_stream_private_t *)p_j2k;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xcc4,
                  "OPJ_BOOL opj_j2k_write_poc(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream == (opj_stream_private_t *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0xcc6,
                    "OPJ_BOOL opj_j2k_write_poc(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    l_poc_size = p_j2k->m_private_image->numcomps;
    l_written_size = (p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].numpocs + 1;
    if (l_poc_size < 0x101) {
      new_header_tile_data._4_4_ = 1;
    }
    else {
      new_header_tile_data._4_4_ = 2;
    }
    l_tcp._4_4_ = (new_header_tile_data._4_4_ * 2 + 5) * l_written_size + 4;
    if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < l_tcp._4_4_) {
      pOVar1 = (OPJ_BYTE *)
               opj_realloc((p_j2k->m_specific_param).m_encoder.m_header_tile_data,(ulong)l_tcp._4_4_
                          );
      if (pOVar1 == (OPJ_BYTE *)0x0) {
        opj_free(p_stream_local->m_current_data);
        p_stream_local->m_current_data = (OPJ_BYTE *)0x0;
        *(undefined4 *)&p_stream_local->m_opj_skip = 0;
        opj_event_msg(_l_nb_poc,1,"Not enough memory to write POC marker\n");
        return 0;
      }
      p_stream_local->m_current_data = pOVar1;
      *(uint *)&p_stream_local->m_opj_skip = l_tcp._4_4_;
    }
    opj_j2k_write_poc_in_memory
              ((opj_j2k_t *)p_stream_local,p_stream_local->m_current_data,(OPJ_UINT32 *)&l_tcp,
               _l_nb_poc);
    OVar2 = opj_stream_write_data
                      ((opj_stream_private_t *)p_manager_local,p_stream_local->m_current_data,
                       (ulong)l_tcp._4_4_,_l_nb_poc);
    p_j2k_local._4_4_ = (uint)(OVar2 == l_tcp._4_4_);
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0xcc5,
                "OPJ_BOOL opj_j2k_write_poc(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_poc(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_nb_comp;
    OPJ_UINT32 l_nb_poc;
    OPJ_UINT32 l_poc_size;
    OPJ_UINT32 l_written_size = 0;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_poc_room;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    l_tcp = &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number];
    l_nb_comp = p_j2k->m_private_image->numcomps;
    l_nb_poc = 1 + l_tcp->numpocs;

    if (l_nb_comp <= 256) {
        l_poc_room = 1;
    } else {
        l_poc_room = 2;
    }
    l_poc_size = 4 + (5 + 2 * l_poc_room) * l_nb_poc;

    if (l_poc_size > p_j2k->m_specific_param.m_encoder.m_header_tile_data_size) {
        OPJ_BYTE *new_header_tile_data = (OPJ_BYTE *) opj_realloc(
                                             p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_poc_size);
        if (! new_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = NULL;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to write POC marker\n");
            return OPJ_FALSE;
        }
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = new_header_tile_data;
        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = l_poc_size;
    }

    opj_j2k_write_poc_in_memory(p_j2k,
                                p_j2k->m_specific_param.m_encoder.m_header_tile_data, &l_written_size,
                                p_manager);

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_poc_size,
                              p_manager) != l_poc_size) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}